

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void Omega_h::fill_linear<double>(Write<double> *a,double offset,double stride)

{
  Alloc *pAVar1;
  size_t sVar2;
  type_conflict2 f;
  type_conflict2 local_30;
  
  Write<double>::Write(&local_30.a,a);
  pAVar1 = (a->shared_alloc_).alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  local_30.offset = offset;
  local_30.stride = stride;
  parallel_for<Omega_h::fill_linear<double>(Omega_h::Write<double>,double,double)::_lambda(int)_1_>
            ((LO)(sVar2 >> 3),&local_30,"Write(size,offset,stride)");
  Write<double>::~Write(&local_30.a);
  return;
}

Assistant:

void fill_linear(Write<T> a, T offset, T stride) {
  auto f = OMEGA_H_LAMBDA(LO i) {
    a[i] = offset + (stride * static_cast<T>(i));
  };
  parallel_for(a.size(), f, "Write(size,offset,stride)");
}